

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

char __thiscall Fl_Preferences::set(Fl_Preferences *this,char *key,char *text)

{
  byte bVar1;
  int iVar2;
  byte *value;
  byte *pbVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  int iVar7;
  
  pcVar4 = "";
  if (text != (char *)0x0) {
    pcVar4 = text;
  }
  cVar6 = *pcVar4;
  if (cVar6 != '\0') {
    iVar2 = 0;
    lVar5 = 1;
    do {
      iVar7 = iVar2 + 4;
      if ((byte)(cVar6 + 0x81U) < 0xa1) {
        iVar2 = iVar7;
      }
      if (cVar6 == '\\') {
        iVar2 = iVar7;
      }
      cVar6 = pcVar4[lVar5];
      lVar5 = lVar5 + 1;
    } while (cVar6 != '\0');
    if (iVar2 != 0) {
      value = (byte *)malloc((long)(iVar2 + (int)lVar5));
      pbVar3 = value;
      do {
        bVar1 = *text;
        if (bVar1 < 0xd) {
          if (bVar1 == 10) {
            pbVar3[0] = 0x5c;
            pbVar3[1] = 0x6e;
            goto LAB_001c5109;
          }
          if (bVar1 == 0) {
            *pbVar3 = 0;
            Node::set(this->node,key,(char *)value);
            free(value);
            return '\x01';
          }
LAB_001c5116:
          if ((byte)(bVar1 + 0x81) < 0xa1) {
            *pbVar3 = 0x5c;
            pbVar3[1] = bVar1 >> 6 | 0x30;
            pbVar3[2] = bVar1 >> 3 & 7 | 0x30;
            pbVar3[3] = bVar1 & 7 | 0x30;
            pbVar3 = pbVar3 + 4;
          }
          else {
            *pbVar3 = bVar1;
            pbVar3 = pbVar3 + 1;
          }
        }
        else {
          if (bVar1 == 0xd) {
            pbVar3[0] = 0x5c;
            pbVar3[1] = 0x72;
          }
          else {
            if (bVar1 != 0x5c) goto LAB_001c5116;
            pbVar3[0] = 0x5c;
            pbVar3[1] = 0x5c;
          }
LAB_001c5109:
          pbVar3 = pbVar3 + 2;
        }
        text = (char *)((byte *)text + 1);
      } while( true );
    }
  }
  Node::set(this->node,key,text);
  return '\x01';
}

Assistant:

char Fl_Preferences::set( const char *key, const char *text ) {
  const char *s = text ? text : "";
  int n=0, ns=0;
  for ( ; *s; s++ ) { n++; if ( *s<32 || *s=='\\' || *s==0x7f ) ns+=4; }
  if ( ns ) {
    char *buffer = (char*)malloc( n+ns+1 ), *d = buffer;
    for ( s=text; *s; ) {
      char c = *s;
      if ( c=='\\' ) { *d++ = '\\'; *d++ = '\\'; s++; }
      else if ( c=='\n' ) { *d++ = '\\'; *d++ = 'n'; s++; }
      else if ( c=='\r' ) { *d++ = '\\'; *d++ = 'r'; s++; }
      else if ( c<32 || c==0x7f )
	{ *d++ = '\\'; *d++ = '0'+((c>>6)&3); *d++ = '0'+((c>>3)&7); *d++ = '0'+(c&7);  s++; }
      else *d++ = *s++;
    }
    *d = 0;
    node->set( key, buffer );
    free( buffer );
  }
  else
    node->set( key, text );
  return 1;
}